

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::sendAdmChan(Server *this,char *fmt,...)

{
  char in_AL;
  long lVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t i;
  long lVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_129;
  string message;
  va_list args;
  string_view local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  args[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  local_e8 = getPrefix(this);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&message,&local_e8,&local_129);
  if (message._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&message,' ');
  }
  vstring_printf_abi_cxx11_((string *)&local_e8,fmt,args);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&message,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
            );
  std::__cxx11::string::~string((string *)&local_e8);
  lVar3 = 0;
  while( true ) {
    lVar1 = ServerManager::size();
    if (lVar3 == lVar1) break;
    uVar2 = ServerManager::getServer(_serverManager);
    Jupiter::IRC::Client::messageChannels
              (uVar2,this->m_adminLogChanType,message._M_string_length,message._M_dataplus._M_p);
    lVar3 = lVar3 + 1;
  }
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void RenX::Server::sendAdmChan(const char *fmt, ...) const {
	va_list args;
	va_start(args, fmt);

	std::string message{ getPrefix() };
	if (!message.empty()) {
		message += ' ';
	}
	message += vstring_printf(fmt, args);

	for (size_t i = 0; i != serverManager->size(); i++) {
		serverManager->getServer(i)->messageChannels(m_adminLogChanType, message);
	}
}